

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha3.c
# Opt level: O0

void keccak_digest(ssh_hash *hash,uchar *output)

{
  keccak_hash *kh;
  uchar *output_local;
  ssh_hash *hash_local;
  
  keccak_output((keccak_state *)(hash + -0x1b),output);
  return;
}

Assistant:

static void keccak_digest(ssh_hash *hash, unsigned char *output)
{
    struct keccak_hash *kh = container_of(hash, struct keccak_hash, hash);
    keccak_output(&kh->state, output);
}